

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausEstimateCoverage(Clu_Man_t *p)

{
  long lVar1;
  uint *pResult;
  uint *puVar2;
  Cnf_Dat_t *pCVar3;
  Aig_Man_t *p_00;
  int *piVar4;
  int iVar5;
  abctime aVar6;
  Fra_Sml_t *p_01;
  int *pVar2Id;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  abctime aVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  
  aVar6 = Abc_Clock();
  Aig_ManRandom(1);
  uVar10 = 0;
  p_01 = Fra_SmlSimulateComb(p->pAig,0x800,0);
  pCVar3 = p->pCnf;
  iVar14 = pCVar3->nVars;
  pVar2Id = (int *)calloc(1,(long)iVar14 << 2);
  p_00 = p->pAig;
  uVar13 = p_00->vObjs->nSize;
  uVar7 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar7 = uVar10;
  }
  do {
    if (uVar7 == uVar10) {
      if (p_00->nObjs[3] < 3) {
        __assert_fail("Aig_ManCoNum(p->pAig) > 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x66a,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
      }
      pAVar8 = Aig_ManCo(p_00,0);
      iVar14 = p_01->nWordsTotal;
      iVar12 = pAVar8->Id;
      pAVar8 = Aig_ManCo(p->pAig,1);
      lVar1 = (long)(p_01->nWordsTotal * pAVar8->Id) * 4;
      for (lVar11 = 0; lVar11 != 0x800; lVar11 = lVar11 + 1) {
        *(undefined4 *)((long)&p_01[1].pAig + lVar11 * 4 + lVar1) = 0;
      }
      pResult = (uint *)((long)&p_01[1].pAig + (long)(iVar14 * iVar12) * 4);
      piVar4 = p->vLitsProven->pArray;
      iVar14 = 0;
      for (iVar12 = 0; iVar12 < p->vClausesProven->nSize; iVar12 = iVar12 + 1) {
        iVar5 = Vec_IntEntry(p->vClausesProven,iVar12);
        Fra_ClausEstimateCoverageOne(p_01,piVar4 + iVar14,iVar5 - iVar14,pVar2Id,pResult);
        for (lVar11 = 0; lVar11 != 0x800; lVar11 = lVar11 + 1) {
          puVar2 = (uint *)((long)&p_01[1].pAig + lVar11 * 4 + lVar1);
          *puVar2 = *puVar2 | pResult[lVar11];
        }
        iVar14 = iVar5;
      }
      iVar14 = 0;
      for (lVar11 = 0; lVar11 != 0x800; lVar11 = lVar11 + 1) {
        uVar13 = *(uint *)((long)&p_01[1].pAig + lVar11 * 4 + lVar1);
        uVar13 = (uVar13 >> 1 & 0x55555555) + (uVar13 & 0x55555555);
        uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
        uVar13 = (uVar13 >> 4 & 0x7070707) + (uVar13 & 0x7070707);
        uVar13 = (uVar13 >> 8 & 0xf000f) + (uVar13 & 0xf000f);
        iVar14 = (uVar13 >> 0x10) + iVar14 + (uVar13 & 0xffff);
      }
      Fra_SmlStop(p_01);
      free(pVar2Id);
      printf("Care states ratio = %f. ",(double)(int)(0x10000U - iVar14) * 1.52587890625e-05);
      iVar12 = 0x810530;
      printf("(%d out of %d patterns)  ",(ulong)(0x10000U - iVar14),0x10000);
      Abc_Print(iVar12,"%s =","Time");
      aVar9 = Abc_Clock();
      Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar9 - aVar6) / 1000000.0);
      return;
    }
    iVar12 = pCVar3->pVarNums[uVar10];
    if (-1 < (long)iVar12) {
      if (iVar14 <= iVar12) {
        __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x666,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
      }
      pVar2Id[iVar12] = (int)uVar10;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Fra_ClausEstimateCoverage( Clu_Man_t * p )
{
    int nCombSimWords = (1<<11);
    Fra_Sml_t * pComb;
    unsigned * pResultTot, * pResultOne;
    int nCovered, Beg, End, i, w;
    int * pStart, * pVar2Id; 
    abctime clk = Abc_Clock();
    // simulate the circuit with nCombSimWords * 32 = 64K patterns
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, nCombSimWords, 0 );
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // get storage for one assignment and all assignments
    assert( Aig_ManCoNum(p->pAig) > 2 );
    pResultOne = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 0)->Id );
    pResultTot = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 1)->Id );
    // start the OR of don't-cares
    for ( w = 0; w < nCombSimWords; w++ )
        pResultTot[w] = 0;
    // check clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        Fra_ClausEstimateCoverageOne( pComb, pStart + Beg, End-Beg, pVar2Id, pResultOne );
        Beg = End;
        for ( w = 0; w < nCombSimWords; w++ )
            pResultTot[w] |= pResultOne[w];
    }
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nCombSimWords; w++ )
        nCovered += Aig_WordCountOnes( pResultTot[w] );
    Fra_SmlStop( pComb );
    ABC_FREE( pVar2Id );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nCombSimWords * 32 - nCovered) / (nCombSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nCombSimWords * 32 - nCovered, nCombSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}